

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  pointer *pppFVar1;
  FieldDescriptor *pFVar2;
  Descriptor *pDVar3;
  iterator __position;
  MessageGenerator *this_00;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  FileOptions_OptimizeMode FVar7;
  int iVar8;
  uint32_t uVar9;
  LogMessage *pLVar10;
  FieldDescriptor *extraout_RAX;
  FieldDescriptor *pFVar11;
  FieldGenerator *pFVar12;
  _Base_ptr p_Var13;
  int iVar14;
  uint32_t uVar15;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *pFVar16;
  FieldDescriptor *field_00;
  int iVar17;
  pointer ppFVar18;
  int *in_R8;
  FieldDescriptor **field_1;
  cpp *this_01;
  pointer ppFVar19;
  FieldDescriptor **field;
  iterator __position_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar20;
  _Base_ptr p_Var21;
  cpp *field_01;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  Hex hex;
  int cached_has_word_index;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  const_iterator __end4;
  string chunk_mask_str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Formatter format;
  ColdChunkSkipper cold_skipper;
  LogFinisher local_181;
  MessageGenerator *local_180;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_178;
  undefined1 local_170 [16];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvStack_160;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_158;
  _Alloc_hider local_148;
  Printer *local_140;
  undefined4 local_134;
  undefined8 local_130;
  undefined1 local_128 [32];
  undefined1 local_108 [8];
  undefined1 local_100 [8];
  undefined1 local_f8 [40];
  Formatter local_d0;
  Options *local_98;
  _Base_ptr local_90;
  ColdChunkSkipper local_88;
  
  pDVar3 = this->descriptor_;
  local_98 = &this->options_;
  local_180 = this;
  local_140 = printer;
  FVar7 = GetOptimizeFor(*(FileDescriptor **)(pDVar3 + 0x10),local_98,(bool *)0x0);
  if (((FVar7 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar3 + 0x78) != 0)) ||
     (*(int *)(pDVar3 + 4) != 0)) {
    local_d0.printer_ = local_140;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_d0.vars_._M_t,&(local_180->variables_)._M_t);
    Formatter::operator()<>
              (&local_d0,
               "void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
              );
    io::Printer::Indent(local_d0.printer_);
    Formatter::operator()<>
              (&local_d0,
               "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
              );
    if (0 < *(int *)(local_180->descriptor_ + 0x78)) {
      Formatter::operator()<>(&local_d0,"_extensions_.Clear();\n");
    }
    ppFVar19 = (local_180->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar18 = (local_180->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar19 == ppFVar18) {
      uVar22 = 0;
      uVar23 = 0;
      local_170._8_8_ =
           (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x0;
      pvStack_160 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)0x0;
      local_158 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)0x0;
      local_134 = 0;
    }
    else {
      iVar17 = 0;
      do {
        bVar5 = CanInitializeByZeroing(*ppFVar19);
        if (bVar5) {
          iVar8 = EstimateAlignmentSize(*ppFVar19);
          iVar17 = iVar17 + iVar8;
        }
        ppFVar19 = ppFVar19 + 1;
      } while (ppFVar19 != ppFVar18);
      ppFVar19 = (local_180->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_130 = (local_180->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_134 = (undefined4)CONCAT71((int7)((ulong)local_180 >> 8),4 < iVar17);
      uVar22 = 0;
      uVar23 = 0;
      local_170._8_8_ =
           (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x0;
      pvStack_160 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)0x0;
      local_158 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)0x0;
      if (ppFVar19 != (pointer)local_130) {
        local_178 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)0x0;
        do {
          __position_00._M_current = pvStack_160;
          this_00 = local_180;
          p_Var21 = (_Base_ptr)*ppFVar19;
          local_88.chunks_ =
               (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                *)p_Var21;
          if ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_170._8_8_ == pvStack_160) {
LAB_002a5db5:
            if (__position_00._M_current == local_158) {
              std::
              vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ::_M_realloc_insert<>
                        ((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          *)(local_170 + 8),__position_00);
              uVar22 = extraout_XMM0_Da;
              uVar23 = extraout_XMM0_Db;
              pvVar20 = local_178;
            }
            else {
              uVar22 = 0;
              uVar23 = 0;
              ((__position_00._M_current)->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              ((__position_00._M_current)->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              ((__position_00._M_current)->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pvStack_160 = pvStack_160 + 1;
              pvVar20 = local_178;
            }
          }
          else {
            local_148._M_p._0_4_ = iVar17;
            pFVar16 = pvStack_160[-1].
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1];
            iVar17 = HasBitIndex(local_180,pFVar16);
            iVar8 = iVar17 + 7;
            if (-1 < iVar17) {
              iVar8 = iVar17;
            }
            iVar8 = iVar8 >> 3;
            if (iVar17 == -1) {
              iVar8 = -1;
            }
            iVar17 = HasBitIndex(this_00,(FieldDescriptor *)p_Var21);
            iVar14 = iVar17 + 7;
            if (-1 < iVar17) {
              iVar14 = iVar17;
            }
            iVar14 = iVar14 >> 3;
            if (iVar17 == -1) {
              iVar14 = -1;
            }
            iVar17 = (int)local_148._M_p;
            if (iVar8 != iVar14) {
              local_178 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)0x0;
              goto LAB_002a5db5;
            }
            if (((~*(byte *)((long)&p_Var21->_M_color + 1) & 0x60) == 0) !=
                ((~(byte)pFVar16[1] & 0x60) == 0)) {
LAB_002a5d9d:
              local_178 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)0x0;
              goto LAB_002a5db5;
            }
            bVar5 = CanInitializeByZeroing(pFVar16);
            bVar6 = CanInitializeByZeroing((FieldDescriptor *)p_Var21);
            pvVar20 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)(ulong)((int)local_178 + 1);
            uVar22 = extraout_XMM0_Da_01;
            uVar23 = extraout_XMM0_Db_01;
            if (bVar5 != bVar6) {
              bVar5 = CanInitializeByZeroing(pFVar16);
              __position_00._M_current = pvStack_160;
              uVar22 = extraout_XMM0_Da_02;
              uVar23 = extraout_XMM0_Db_02;
              if (!bVar5 || (int)local_178 != 0 && iVar17 < 5) goto LAB_002a5d9d;
            }
          }
          local_178 = pvVar20;
          __position._M_current =
               pvStack_160[-1].
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              pvStack_160[-1].
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)(pvStack_160 + -1),__position,(FieldDescriptor **)&local_88);
            uVar22 = extraout_XMM0_Da_00;
            uVar23 = extraout_XMM0_Db_00;
          }
          else {
            *__position._M_current = (FieldDescriptor *)local_88.chunks_;
            pppFVar1 = &pvStack_160[-1].
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppFVar1 = *pppFVar1 + 1;
          }
          ppFVar19 = ppFVar19 + 1;
        } while (ppFVar19 != (pointer)local_130);
      }
    }
    local_130 = &local_180->has_bit_indices_;
    anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
              (&local_88,local_98,
               (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                *)(local_170 + 8),(vector<int,_std::allocator<int>_> *)local_130,
               (double)CONCAT44(uVar23,uVar22));
    local_170._0_4_ = -1;
    if (pvStack_160 !=
        (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)local_170._8_8_) {
      local_148._M_p = (pointer)&local_180->field_generators_;
      p_Var21 = (_Base_ptr)0x0;
      do {
        uVar4 = local_170._8_8_;
        local_128._0_8_ = local_128 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
        local_108 = (undefined1  [8])local_140;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_100,&local_88.variables_._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_100);
        if ((FieldDescriptor *)local_128._0_8_ != (FieldDescriptor *)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_);
        }
        local_178 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)(uVar4 + p_Var21 * 0x18);
        ppFVar18 = (local_178->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppFVar19 = (local_178->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        local_90 = p_Var21;
        if (ppFVar18 == ppFVar19) {
          this_01 = (cpp *)0x0;
          field_01 = (cpp *)0x0;
        }
        else {
          field_01 = (cpp *)0x0;
          this_01 = (cpp *)0x0;
          bVar5 = false;
          do {
            bVar6 = CanInitializeByZeroing(*ppFVar18);
            if (bVar6) {
              if (bVar5) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xccd);
                pLVar10 = internal::LogMessage::operator<<
                                    ((LogMessage *)local_108,"CHECK failed: !saw_non_zero_init: ");
                internal::LogFinisher::operator=((LogFinisher *)local_128,pLVar10);
                internal::LogMessage::~LogMessage((LogMessage *)local_108);
              }
              this_01 = (cpp *)*ppFVar18;
              if (field_01 == (cpp *)0x0) {
                field_01 = this_01;
              }
            }
            else {
              bVar5 = true;
            }
            ppFVar18 = ppFVar18 + 1;
          } while (ppFVar18 != ppFVar19);
          ppFVar18 = (local_178->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        }
        iVar17 = HasBitIndex(local_180,*ppFVar18);
        if (((iVar17 == -1) ||
            (ppFVar19 = (local_178->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish,
            (ulong)((long)ppFVar19 - (long)ppFVar18) < 9)) ||
           (this_01 == (cpp *)ppFVar19[-1] && (local_134 & 1) == 0)) {
          local_170._4_4_ = 0;
          pFVar16 = extraout_RDX;
        }
        else {
          uVar9 = anon_unknown_0::GenChunkMask
                            (local_178,(vector<int,_std::allocator<int>_> *)local_130);
          hex.value = (ulong)uVar9;
          hex._8_8_ = 8;
          strings::AlphaNum::AlphaNum((AlphaNum *)local_108,hex);
          local_128._0_8_ = local_128 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,local_108,
                     (pointer)((long)local_108 + (long)(_Rb_tree_color *)local_100));
          if (uVar9 == 0) {
LAB_002a60ae:
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xce7);
            pLVar10 = internal::LogMessage::operator<<
                                ((LogMessage *)local_108,
                                 "CHECK failed: (2) <= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=(&local_181,pLVar10);
            internal::LogMessage::~LogMessage((LogMessage *)local_108);
          }
          else {
            iVar17 = 0;
            uVar15 = uVar9;
            do {
              iVar17 = iVar17 + (uVar15 & 1);
              bVar5 = 1 < uVar15;
              uVar15 = uVar15 >> 1;
            } while (bVar5);
            if (iVar17 < 2) goto LAB_002a60ae;
          }
          if (uVar9 != 0) {
            iVar17 = 0;
            do {
              iVar17 = iVar17 + (uVar9 & 1);
              bVar5 = 1 < uVar9;
              uVar9 = uVar9 >> 1;
            } while (bVar5);
            if (8 < iVar17) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_108,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xce8);
              pLVar10 = internal::LogMessage::operator<<
                                  ((LogMessage *)local_108,
                                   "CHECK failed: (8) >= (popcnt(chunk_mask)): ");
              internal::LogFinisher::operator=(&local_181,pLVar10);
              internal::LogMessage::~LogMessage((LogMessage *)local_108);
            }
          }
          uVar22 = local_170._0_4_;
          iVar8 = HasBitIndex(local_180,
                              *(local_178->
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               )._M_impl.super__Vector_impl_data._M_start);
          iVar17 = iVar8 + 0x1f;
          if (-1 < iVar8) {
            iVar17 = iVar8;
          }
          iVar17 = iVar17 >> 5;
          if (iVar8 == -1) {
            iVar17 = -1;
          }
          if (uVar22 != iVar17) {
            local_170._0_4_ = iVar17;
            Formatter::operator()(&local_d0,"cached_has_bits = _has_bits_[$1$];\n",(int *)local_170)
            ;
          }
          Formatter::operator()(&local_d0,"if (cached_has_bits & 0x$1$u) {\n",(string *)local_128);
          io::Printer::Indent(local_d0.printer_);
          pFVar11 = (FieldDescriptor *)(local_128 + 0x10);
          pFVar16 = extraout_RDX_00;
          if ((FieldDescriptor *)local_128._0_8_ != pFVar11) {
            operator_delete((void *)local_128._0_8_);
            pFVar11 = extraout_RAX;
            pFVar16 = extraout_RDX_01;
          }
          local_170._4_4_ = (undefined4)CONCAT71((int7)((ulong)pFVar11 >> 8),1);
        }
        if (field_01 != (cpp *)0x0) {
          if (field_01 == this_01) {
            pFVar12 = FieldGeneratorMap::get
                                ((FieldGeneratorMap *)local_148._M_p,(FieldDescriptor *)field_01);
            (*pFVar12->_vptr_FieldGenerator[0xb])(pFVar12,local_140);
          }
          else {
            FieldName_abi_cxx11_((string *)local_108,field_01,pFVar16);
            FieldName_abi_cxx11_((string *)local_128,this_01,field_00);
            Formatter::operator()
                      (&local_d0,
                       "::memset(&$1$_, 0, static_cast<size_t>(\n    reinterpret_cast<char*>(&$2$_) -\n    reinterpret_cast<char*>(&$1$_)) + sizeof($2$_));\n"
                       ,(string *)local_108,(string *)local_128);
            if ((FieldDescriptor *)local_128._0_8_ != (FieldDescriptor *)(local_128 + 0x10)) {
              operator_delete((void *)local_128._0_8_);
            }
            if (local_108 != (undefined1  [8])local_f8) {
              operator_delete((void *)local_108);
            }
          }
        }
        ppFVar18 = (local_178->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        for (ppFVar19 = (local_178->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppFVar19 != ppFVar18;
            ppFVar19 = ppFVar19 + 1) {
          bVar5 = CanInitializeByZeroing(*ppFVar19);
          if (!bVar5) {
            pFVar16 = *ppFVar19;
            iVar17 = HasBitIndex(local_180,pFVar16);
            if (iVar17 == -1) {
LAB_002a6375:
              bVar5 = false;
            }
            else {
              pFVar11 = pFVar16;
              if (*(once_flag **)(pFVar16 + 0x18) != (once_flag *)0x0) {
                local_108 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
                local_128._0_8_ = pFVar16;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (*(once_flag **)(pFVar16 + 0x18),
                           (_func_void_FieldDescriptor_ptr **)local_108,
                           (FieldDescriptor **)local_128);
                pFVar11 = *ppFVar19;
              }
              pFVar2 = pFVar16 + 2;
              pFVar16 = pFVar11;
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)*pFVar2 * 4) != 10) {
                if (*(once_flag **)(pFVar11 + 0x18) != (once_flag *)0x0) {
                  local_108 = (undefined1  [8])FieldDescriptor::TypeOnceInit;
                  local_128._0_8_ = pFVar11;
                  std::
                  call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                            (*(once_flag **)(pFVar11 + 0x18),
                             (_func_void_FieldDescriptor_ptr **)local_108,
                             (FieldDescriptor **)local_128);
                  pFVar16 = *ppFVar19;
                }
                if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar11[2] * 4) != 9)
                goto LAB_002a6375;
              }
              anon_unknown_0::PrintPresenceCheck
                        (&local_d0,pFVar16,*(vector<int,_std::allocator<int>_> **)local_130,
                         (Printer *)local_170,in_R8);
              pFVar16 = *ppFVar19;
              bVar5 = true;
            }
            pFVar12 = FieldGeneratorMap::get((FieldGeneratorMap *)local_148._M_p,pFVar16);
            (*pFVar12->_vptr_FieldGenerator[0xb])(pFVar12,local_140);
            if (bVar5) {
              io::Printer::Outdent(local_d0.printer_);
              Formatter::operator()<>(&local_d0,"}\n");
            }
          }
        }
        if (local_170[4] != '\0') {
          io::Printer::Outdent(local_d0.printer_);
          Formatter::operator()<>(&local_d0,"}\n");
        }
        bVar5 = anon_unknown_0::ColdChunkSkipper::OnEndChunk(&local_88,(int)local_90,local_140);
        if (bVar5) {
          local_170._0_4_ = -1;
        }
        p_Var21 = (_Base_ptr)((long)&local_90->_M_color + 1);
        p_Var13 = (_Base_ptr)(((long)pvStack_160 - local_170._8_8_ >> 3) * -0x5555555555555555);
      } while (p_Var21 <= p_Var13 && (long)p_Var13 - (long)p_Var21 != 0);
    }
    local_128._8_8_ = local_180->descriptor_;
    local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
    local_128._0_4_ = *(undefined4 *)((long)&((_Base_ptr)(local_128._8_8_ + 0x60))->_M_parent + 4);
    local_100 = (undefined1  [8])local_128._8_8_;
    while (bVar5 = operator==((Iterator *)local_108,(Iterator *)local_128), !bVar5) {
      Formatter::operator()
                (&local_d0,"clear_$1$();\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)((_Base_ptr)((long)local_100 + 0x20))->_M_left +
                  (long)(int)local_108._0_4_ * 0x28 + 8));
      local_108._0_4_ = local_108._0_4_ + LOGLEVEL_WARNING;
    }
    if (local_180->num_weak_fields_ != 0) {
      Formatter::operator()<>(&local_d0,"_weak_field_map_.ClearAll();\n");
    }
    if ((local_180->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (local_180->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Formatter::operator()<>(&local_d0,"_has_bits_.Clear();\n");
    }
    local_f8._8_8_ = local_100;
    local_100 = (undefined1  [8])((ulong)local_100 & 0xffffffff00000000);
    local_f8._0_8_ = 0;
    local_f8._24_8_ = (_Base_ptr)0x0;
    local_f8._16_8_ = local_f8._8_8_;
    SetUnknownFieldsVariable
              (local_180->descriptor_,local_98,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_108);
    Formatter::AddMap(&local_d0,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_108);
    Formatter::operator()<>(&local_d0,"_internal_metadata_.Clear<$unknown_fields_type$>();\n");
    io::Printer::Outdent(local_d0.printer_);
    Formatter::operator()<>(&local_d0,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_108);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_88.variables_._M_t);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               *)(local_170 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_d0.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  // The maximum number of bytes we will memset to zero without checking their
  // hasbit to see if a zero-init is necessary.
  const int kMaxUnconditionalPrimitiveBytesClear = 4;

  format(
      "void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n");
  format.Indent();

  format(
      // TODO(jwb): It would be better to avoid emitting this if it is not used,
      // rather than emitting a workaround for the resulting warning.
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  if (descriptor_->extension_range_count() > 0) {
    format("_extensions_.Clear();\n");
  }

  // Collect fields into chunks. Each chunk may have an if() condition that
  // checks all hasbits in the chunk and skips it if none are set.
  int zero_init_bytes = 0;
  for (const auto& field : optimized_order_) {
    if (CanInitializeByZeroing(field)) {
      zero_init_bytes += EstimateAlignmentSize(field);
    }
  }
  bool merge_zero_init = zero_init_bytes > kMaxUnconditionalPrimitiveBytesClear;
  int chunk_count = 0;

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        chunk_count++;
        // This predicate guarantees that there is only a single zero-init
        // (memset) per chunk, and if present it will be at the beginning.
        bool same = HasByteIndex(a) == HasByteIndex(b) &&
                    a->is_repeated() == b->is_repeated() &&
                    (CanInitializeByZeroing(a) == CanInitializeByZeroing(b) ||
                     (CanInitializeByZeroing(a) &&
                      (chunk_count == 1 || merge_zero_init)));
        if (!same) chunk_count = 0;
        return same;
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    const FieldDescriptor* memset_start = nullptr;
    const FieldDescriptor* memset_end = nullptr;
    bool saw_non_zero_init = false;

    for (const auto& field : chunk) {
      if (CanInitializeByZeroing(field)) {
        GOOGLE_CHECK(!saw_non_zero_init);
        if (!memset_start) memset_start = field;
        memset_end = field;
      } else {
        saw_non_zero_init = true;
      }
    }

    // Whether we wrap this chunk in:
    //   if (cached_has_bits & <chunk hasbits) { /* chunk. */ }
    // We can omit the if() for chunk size 1, or if our fields do not have
    // hasbits. I don't understand the rationale for the last part of the
    // condition, but it matches the old logic.
    const bool have_outer_if = HasBitIndex(chunk.front()) != kNoHasbit &&
                               chunk.size() > 1 &&
                               (memset_end != chunk.back() || merge_zero_init);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    if (memset_start) {
      if (memset_start == memset_end) {
        // For clarity, do not memset a single field.
        field_generators_.get(memset_start)
            .GenerateMessageClearingCode(printer);
      } else {
        format(
            "::memset(&$1$_, 0, static_cast<size_t>(\n"
            "    reinterpret_cast<char*>(&$2$_) -\n"
            "    reinterpret_cast<char*>(&$1$_)) + sizeof($2$_));\n",
            FieldName(memset_start), FieldName(memset_end));
      }
    }

    // Clear all non-zero-initializable fields in the chunk.
    for (const auto& field : chunk) {
      if (CanInitializeByZeroing(field)) continue;
      // It's faster to just overwrite primitive types, but we should only
      // clear strings and messages if they were set.
      //
      // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
      bool have_enclosing_if =
          HasBitIndex(field) != kNoHasbit &&
          (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
           field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);

      if (have_enclosing_if) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
      }

      field_generators_.get(field).GenerateMessageClearingCode(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Step 4: Unions.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("clear_$1$();\n", oneof->name());
  }

  if (num_weak_fields_) {
    format("_weak_field_map_.ClearAll();\n");
  }

  // We don't clear donated status.

  if (!has_bit_indices_.empty()) {
    // Step 5: Everything else.
    format("_has_bits_.Clear();\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);
  format("_internal_metadata_.Clear<$unknown_fields_type$>();\n");

  format.Outdent();
  format("}\n");
}